

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalPrinter<std::optional<wasm::Name>_>::Print
               (Optional<wasm::Name> *value,ostream *os)

{
  bool bVar1;
  Name *value_00;
  ostream *os_local;
  Optional<wasm::Name> *value_local;
  
  std::operator<<(os,'(');
  bVar1 = std::optional::operator_cast_to_bool((optional *)value);
  if (bVar1) {
    value_00 = std::optional<wasm::Name>::operator*(value);
    UniversalPrint<wasm::Name>(value_00,os);
  }
  else {
    std::operator<<(os,"nullopt");
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }